

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::java::anon_unknown_0::FieldDescriptorCompare::operator()
          (FieldDescriptorCompare *this,FieldDescriptor *f1,FieldDescriptor *f2)

{
  char *pcVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  
  if (this == (FieldDescriptorCompare *)0x0) {
    return false;
  }
  if (f1 != (FieldDescriptor *)0x0) {
    __x._M_len = (ulong)*(ushort *)(*(long *)(this + 8) + 2);
    pcVar1 = (f1->all_names_).payload_;
    __y._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    __y._M_str = pcVar1 + ~__y._M_len;
    __x._M_str = (char *)(~__x._M_len + *(long *)(this + 8));
    bVar2 = std::operator<(__x,__y);
    return bVar2;
  }
  return true;
}

Assistant:

bool operator()(const FieldDescriptor* f1, const FieldDescriptor* f2) const {
    if (f1 == nullptr) {
      return false;
    }
    if (f2 == nullptr) {
      return true;
    }
    return f1->full_name() < f2->full_name();
  }